

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QObject_const*,QStyleAnimation*>::emplace<QStyleAnimation*const&>
          (QHash<QObject_const*,QStyleAnimation*> *this,QObject **key,QStyleAnimation **args)

{
  QStyleAnimation *pQVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<const_QObject_*,_QStyleAnimation_*>_> *pDVar3;
  long in_FS_OFFSET;
  piter pVar4;
  QHash<const_QObject_*,_QStyleAnimation_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QStyleAnimation **)this;
  if (pQVar1 != (QStyleAnimation *)0x0) {
    if (*(uint *)pQVar1 < 2) {
      uVar2._0_4_ = pQVar1->_delay;
      uVar2._4_4_ = pQVar1->_duration;
      if (*(ulong *)&pQVar1->field_0x8 < uVar2 >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar4 = (piter)emplace_helper<QStyleAnimation*const&>(this,key,args);
          return (iterator)pVar4;
        }
      }
      else {
        local_28.d = (Data *)*args;
        pVar4 = (piter)emplace_helper<QStyleAnimation*>(this,key,(QStyleAnimation **)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar4;
        }
      }
      goto LAB_0033e6ed;
    }
    if ((pQVar1 != (QStyleAnimation *)0x0) && (*(uint *)pQVar1 != 0xffffffff)) {
      LOCK();
      *(uint *)pQVar1 = *(uint *)pQVar1 + 1;
      UNLOCK();
    }
  }
  pDVar3 = *(Data<QHashPrivate::Node<const_QObject_*,_QStyleAnimation_*>_> **)this;
  local_28.d = (Data *)pQVar1;
  if ((pDVar3 == (Data<QHashPrivate::Node<const_QObject_*,_QStyleAnimation_*>_> *)0x0) ||
     (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    pDVar3 = QHashPrivate::Data<QHashPrivate::Node<const_QObject_*,_QStyleAnimation_*>_>::detached
                       (pDVar3);
    *(Data<QHashPrivate::Node<const_QObject_*,_QStyleAnimation_*>_> **)this = pDVar3;
  }
  pVar4 = (piter)emplace_helper<QStyleAnimation*const&>(this,key,args);
  QHash<const_QObject_*,_QStyleAnimation_*>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
LAB_0033e6ed:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }